

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::ShutdownProtobufLibrary(void)

{
  vector<void_(*)(),_std::allocator<void_(*)()>_> *pvVar1;
  Mutex *pMVar2;
  size_type sVar3;
  reference pp_Var4;
  int local_c;
  int i;
  
  internal::InitShutdownFunctionsOnce();
  if (internal::shutdown_functions != (vector<void_(*)(),_std::allocator<void_(*)()>_> *)0x0) {
    for (local_c = 0;
        sVar3 = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::size
                          (internal::shutdown_functions), pvVar1 = internal::shutdown_functions,
        (ulong)(long)local_c < sVar3; local_c = local_c + 1) {
      pp_Var4 = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::at
                          (internal::shutdown_functions,(long)local_c);
      (**pp_Var4)();
    }
    if (internal::shutdown_functions != (vector<void_(*)(),_std::allocator<void_(*)()>_> *)0x0) {
      std::vector<void_(*)(),_std::allocator<void_(*)()>_>::~vector(internal::shutdown_functions);
      operator_delete(pvVar1,0x18);
    }
    pMVar2 = internal::shutdown_functions_mutex;
    internal::shutdown_functions = (vector<void_(*)(),_std::allocator<void_(*)()>_> *)0x0;
    if (internal::shutdown_functions_mutex != (Mutex *)0x0) {
      internal::Mutex::~Mutex(internal::shutdown_functions_mutex);
      operator_delete(pMVar2,8);
    }
    internal::shutdown_functions_mutex = (Mutex *)0x0;
  }
  return;
}

Assistant:

void ShutdownProtobufLibrary() {
  internal::InitShutdownFunctionsOnce();

  // We don't need to lock shutdown_functions_mutex because it's up to the
  // caller to make sure that no one is using the library before this is
  // called.

  // Make it safe to call this multiple times.
  if (internal::shutdown_functions == NULL) return;

  for (int i = 0; i < internal::shutdown_functions->size(); i++) {
    internal::shutdown_functions->at(i)();
  }
  delete internal::shutdown_functions;
  internal::shutdown_functions = NULL;
  delete internal::shutdown_functions_mutex;
  internal::shutdown_functions_mutex = NULL;
}